

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.cpp
# Opt level: O1

long Imath_3_2::lrand48(void)

{
  long lVar1;
  
  lVar1 = (ulong)CONCAT42(CONCAT22(_DAT_0014d0c0,_DAT_0014d0be),(anonymous_namespace)::staticState)
          * 0x5deece66d + 0xb;
  _DAT_0014d0c0 = (short)((ulong)lVar1 >> 0x20);
  _DAT_0014d0be = (short)((ulong)lVar1 >> 0x10);
  (anonymous_namespace)::staticState = (short)lVar1;
  return (ulong)(((uint)((ulong)lVar1 >> 0x20) & 0xffff) << 0xf | (uint)lVar1 >> 0x11);
}

Assistant:

void
rand48Next (unsigned short state[3])
{
    //
    // drand48() and friends are all based on a linear congruential
    // sequence,
    //
    //   x[n+1] = (a * x[n] + c) % m,
    //
    // where a and c are as specified below, and m == (1 << 48)
    //

    static const uint64_t a = uint64_t (0x5deece66dLL);
    static const uint64_t c = uint64_t (0xbLL);

    //
    // Assemble the 48-bit value x[n] from the
    // three 16-bit values stored in state.
    //

    // clang-format off
    uint64_t x = (uint64_t (state[2]) << 32) |
	      (uint64_t (state[1]) << 16) |
	       uint64_t (state[0]);
    // clang-format on

    //
    // Compute x[n+1], except for the "modulo m" part.
    //

    x = a * x + c;

    //
    // Disassemble the 48 least significant bits of x[n+1] into
    // three 16-bit values.  Discard the 16 most significant bits;
    // this takes care of the "modulo m" operation.
    //
    // We assume that sizeof (unsigned short) == 2.
    //

    state[2] = (unsigned short) (x >> 32);
    state[1] = (unsigned short) (x >> 16);
    state[0] = (unsigned short) (x);
}